

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<float>_> *this)

{
  int64_t newRows;
  TPZMatrix<std::complex<float>_> *pTVar1;
  complex<float> in_R9;
  int in_stack_ffffffffffffff58;
  TPZFMatrix<std::complex<float>_> temp1;
  
  TPZFMatrix<std::complex<float>_>::TPZFMatrix
            (&temp1,(long)this->fNEquations,(this->fCoarseIndex).fNElements);
  newRows = (this->fCoarseIndex).fNElements;
  TPZFMatrix<std::complex<float>_>::Resize(&this->fKCi,newRows,newRows);
  pTVar1 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar1,&this->fPhiC,&temp1,0);
  TPZFMatrix<std::complex<float>_>::MultAdd
            (&this->fPhiC,&temp1,&temp1,&this->fKCi,(complex<float>)0x1,in_R9,
             in_stack_ffffffffffffff58);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&temp1);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}